

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnodewalk.h
# Opt level: O3

ResultType __thiscall
ParseNodeWalker<WalkerPolicyTest>::WalkClass
          (ParseNodeWalker<WalkerPolicyTest> *this,ParseNodeClass *pnode,Context context)

{
  bool bVar1;
  ResultType RVar2;
  int iVar3;
  Context in_RCX;
  undefined1 uVar4;
  
  bVar1 = ThreadContext::IsCurrentStackAvailable(0x2400);
  uVar4 = 1;
  if (bVar1) {
    iVar3 = (**(this->super_WalkerPolicyTest).
               super_WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>.
               _vptr_WalkerPolicyBase)(this,pnode->pnodeExtends,context);
    uVar4 = (undefined1)iVar3;
    bVar1 = ThreadContext::IsCurrentStackAvailable(0x2400);
    if (bVar1) {
      iVar3 = (**(this->super_WalkerPolicyTest).
                 super_WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>.
                 _vptr_WalkerPolicyBase)(this,pnode->pnodeConstructor,context);
      uVar4 = (undefined1)iVar3;
      bVar1 = ThreadContext::IsCurrentStackAvailable(0x2400);
      if (bVar1) {
        RVar2 = WalkList(this,(ParseNode *)&pnode->pnodeMembers,(ParseNode **)context,in_RCX);
        return RVar2;
      }
    }
  }
  return (ResultType)uVar4;
}

Assistant:

ResultType WalkClass(ParseNodeClass *pnode, Context context)
    {
        // First walk the class node itself
        ResultType result = WalkNode(pnode, context);
        if (!ContinueWalk(result)) return result;
        // Walk extends expr
        result = WalkFirstChild(pnode->pnodeExtends, context);
        if (!ContinueWalk(result)) return result;
        // Walk the constructor
        result = WalkNthChild(pnode, pnode->pnodeConstructor, context);
        if (!ContinueWalk(result)) return result;
        // Walk all non-static members
        result = WalkList(pnode, pnode->pnodeMembers, context);
        return result;
    }